

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

longlong testinator::detail::Arbitrary_Arithmetic<long_long>::generate
                   (size_t generation,unsigned_long randomSeed)

{
  TestRegistry *this;
  longlong lVar1;
  longlong lVar2;
  undefined1 local_38 [8];
  uniform_int_distribution<long_long> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation == 0) {
    generation_local = 0;
  }
  else if (generation == 1) {
    generation_local = ::std::numeric_limits<long_long>::min();
  }
  else if (generation == 2) {
    generation_local = ::std::numeric_limits<long_long>::max();
  }
  else {
    this = GetTestRegistry();
    dis._M_param._M_b = (longlong)TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)dis._M_param._M_b,randomSeed);
    lVar1 = ::std::numeric_limits<long_long>::min();
    lVar2 = ::std::numeric_limits<long_long>::max();
    ::std::uniform_int_distribution<long_long>::uniform_int_distribution
              ((uniform_int_distribution<long_long> *)local_38,lVar1 + 1,lVar2 + -1);
    generation_local =
         ::std::uniform_int_distribution<long_long>::operator()
                   ((uniform_int_distribution<long_long> *)local_38,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)dis._M_param._M_b);
  }
  return generation_local;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<T> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return dis(gen);
          }
        }
      }